

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

int FinishRow(void *arg1,void *arg2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  size_t __n;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint8_t *puVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint8_t *puVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  uint8_t *puVar25;
  size_t __n_00;
  long lVar26;
  long lVar27;
  long lVar28;
  
  iVar8 = *(int *)((long)arg1 + 0xd8);
  bVar1 = ""[*(int *)((long)arg1 + 0xb68)];
  uVar13 = (uint)bVar1;
  iVar9 = *(int *)((long)arg1 + 0xb40);
  iVar24 = *(int *)((long)arg1 + 0xb44);
  lVar10 = *(long *)((long)arg1 + 0xb28);
  lVar23 = *(long *)((long)arg1 + 0xb30);
  lVar28 = *(long *)((long)arg1 + 0xb38);
  iVar4 = *(int *)((long)arg1 + 0xdc);
  iVar17 = *(int *)((long)arg1 + 0x1ac);
  if (*(int *)((long)arg1 + 200) == 2) {
    ReconstructRow((VP8Decoder *)arg1,(VP8ThreadContext *)((long)arg1 + 0xd8));
  }
  __n_00 = (ulong)uVar13 * (long)iVar9;
  __n = (size_t)(int)((uint)(bVar1 >> 1) * iVar24);
  if ((*(int *)((long)arg1 + 0xe0) != 0) &&
     (lVar19 = (long)*(int *)((long)arg1 + 0x1a0),
     *(int *)((long)arg1 + 0x1a0) < *(int *)((long)arg1 + 0x1a8))) {
    iVar14 = *(int *)((long)arg1 + 0xdc);
    lVar15 = lVar19 * 8;
    lVar26 = lVar19 << 4;
    do {
      lVar22 = *(long *)((long)arg1 + 0xe8);
      bVar1 = *(byte *)(lVar22 + lVar19 * 4);
      if (bVar1 != 0) {
        iVar5 = *(int *)((long)arg1 + 0xb40);
        puVar25 = (uint8_t *)
                  ((long)(*(int *)((long)arg1 + 0xd8) * iVar5 * 0x10) +
                   *(long *)((long)arg1 + 0xb28) + lVar26);
        if (*(int *)((long)arg1 + 0xb68) == 1) {
          if (0 < lVar19) {
            (*VP8SimpleHFilter16)(puVar25,iVar5,bVar1 + 4);
          }
          if (*(char *)(lVar22 + 2 + lVar19 * 4) != '\0') {
            (*VP8SimpleHFilter16i)(puVar25,iVar5,(uint)bVar1);
          }
          if (0 < iVar14) {
            (*VP8SimpleVFilter16)(puVar25,iVar5,bVar1 + 4);
          }
          if (*(char *)(lVar22 + 2 + lVar19 * 4) != '\0') {
            (*VP8SimpleVFilter16i)(puVar25,iVar5,(uint)bVar1);
          }
        }
        else {
          bVar2 = *(byte *)(lVar22 + 1 + lVar19 * 4);
          iVar12 = *(int *)((long)arg1 + 0xb44);
          lVar20 = (long)(*(int *)((long)arg1 + 0xd8) * iVar12 * 8);
          puVar21 = (uint8_t *)(*(long *)((long)arg1 + 0xb30) + lVar20 + lVar15);
          puVar16 = (uint8_t *)(lVar20 + *(long *)((long)arg1 + 0xb38) + lVar15);
          bVar3 = *(byte *)(lVar22 + 3 + lVar19 * 4);
          uVar11 = (uint)bVar2;
          if (0 < lVar19) {
            (*VP8HFilter16)(puVar25,iVar5,bVar1 + 4,uVar11,(uint)bVar3);
            (*VP8HFilter8)(puVar21,puVar16,iVar12,bVar1 + 4,uVar11,(uint)bVar3);
          }
          uVar18 = (uint)bVar3;
          if (*(char *)(lVar22 + 2 + lVar19 * 4) != '\0') {
            (*VP8HFilter16i)(puVar25,iVar5,(uint)bVar1,uVar11,uVar18);
            (*VP8HFilter8i)(puVar21,puVar16,iVar12,(uint)bVar1,uVar11,uVar18);
          }
          if (0 < iVar14) {
            (*VP8VFilter16)(puVar25,iVar5,bVar1 + 4,uVar11,uVar18);
            (*VP8VFilter8)(puVar21,puVar16,iVar12,bVar1 + 4,uVar11,uVar18);
          }
          if (*(char *)(lVar22 + 2 + lVar19 * 4) != '\0') {
            (*VP8VFilter16i)(puVar25,iVar5,(uint)bVar1,(uint)bVar2,uVar18);
            (*VP8VFilter8i)(puVar21,puVar16,iVar12,(uint)bVar1,(uint)bVar2,uVar18);
          }
        }
      }
      lVar19 = lVar19 + 1;
      lVar15 = lVar15 + 8;
      lVar26 = lVar26 + 0x10;
    } while (lVar19 < *(int *)((long)arg1 + 0x1a8));
  }
  lVar19 = (long)iVar8 * (long)iVar9 * 0x10;
  lVar15 = (long)(iVar24 * iVar8 * 8);
  if (*(int *)((long)arg1 + 0x338) != 0) {
    lVar26 = (long)*(int *)((long)arg1 + 0x1a0);
    iVar9 = *(int *)((long)arg1 + 0x1a8);
    if (*(int *)((long)arg1 + 0x1a0) < iVar9) {
      lVar22 = lVar26 * 8;
      lVar20 = lVar26 * 100;
      do {
        lVar6 = *(long *)((long)arg1 + 0xf0);
        uVar11 = (uint)*(byte *)(lVar6 + 0x31c + lVar20 * 8);
        if (3 < uVar11) {
          iVar9 = *(int *)((long)arg1 + 0xb44);
          lVar27 = (long)(*(int *)((long)arg1 + 0xd8) * iVar9 * 8);
          lVar7 = *(long *)((long)arg1 + 0xb38);
          Dither8x8((VP8Random *)((long)arg1 + 0x33c),
                    (uint8_t *)(*(long *)((long)arg1 + 0xb30) + lVar27 + lVar22),iVar9,uVar11);
          Dither8x8((VP8Random *)((long)arg1 + 0x33c),(uint8_t *)(lVar27 + lVar7 + lVar22),iVar9,
                    (uint)*(byte *)(lVar6 + 0x31c + lVar20 * 8));
          iVar9 = *(int *)((long)arg1 + 0x1a8);
        }
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 8;
        lVar20 = lVar20 + 100;
      } while (lVar26 < iVar9);
    }
  }
  lVar10 = (lVar10 - __n_00) + lVar19;
  lVar23 = (lVar23 - __n) + lVar15;
  lVar28 = (lVar28 - __n) + lVar15;
  iVar17 = iVar17 + -1;
  iVar9 = 1;
  if (*(long *)((long)arg2 + 0x40) != 0) {
    if (iVar4 == 0) {
      lVar19 = lVar19 + *(long *)((long)arg1 + 0xb28);
      lVar26 = *(long *)((long)arg1 + 0xb30) + lVar15;
      lVar15 = lVar15 + *(long *)((long)arg1 + 0xb38);
      iVar24 = 0;
    }
    else {
      iVar24 = iVar4 * 0x10 - uVar13;
      lVar26 = lVar23;
      lVar19 = lVar10;
      lVar15 = lVar28;
    }
    puVar25 = (uint8_t *)0x0;
    *(long *)((long)arg2 + 0x18) = lVar19;
    *(long *)((long)arg2 + 0x20) = lVar26;
    *(long *)((long)arg2 + 0x28) = lVar15;
    if (iVar17 <= iVar4) {
      uVar13 = 0;
    }
    iVar14 = (iVar4 * 0x10 + 0x10) - uVar13;
    if (*(int *)((long)arg2 + 0x84) <= iVar14) {
      iVar14 = *(int *)((long)arg2 + 0x84);
    }
    *(undefined8 *)((long)arg2 + 0x98) = 0;
    if ((*(long *)((long)arg1 + 0xb98) != 0) && (iVar14 - iVar24 != 0 && iVar24 <= iVar14)) {
      puVar25 = VP8DecompressAlphaRows((VP8Decoder *)arg1,(VP8Io *)arg2,iVar24,iVar14 - iVar24);
      *(uint8_t **)((long)arg2 + 0x98) = puVar25;
      if (puVar25 == (uint8_t *)0x0) {
        iVar8 = VP8SetError((VP8Decoder *)arg1,VP8_STATUS_BITSTREAM_ERROR,
                            "Could not decode alpha data.");
        return iVar8;
      }
    }
    iVar9 = 1;
    iVar5 = *(int *)((long)arg2 + 0x80);
    iVar12 = iVar5 - iVar24;
    if (iVar12 != 0 && iVar24 <= iVar5) {
      *(long *)((long)arg2 + 0x18) =
           *(long *)((long)arg2 + 0x18) + (long)*(int *)((long)arg1 + 0xb40) * (long)iVar12;
      lVar19 = (long)(iVar12 >> 1) * (long)*(int *)((long)arg1 + 0xb44);
      *(long *)((long)arg2 + 0x20) = *(long *)((long)arg2 + 0x20) + lVar19;
      *(long *)((long)arg2 + 0x28) = *(long *)((long)arg2 + 0x28) + lVar19;
      iVar24 = iVar5;
      if (puVar25 == (uint8_t *)0x0) {
        puVar25 = (uint8_t *)0x0;
      }
      else {
        puVar25 = puVar25 + (long)*arg2 * (long)iVar12;
        *(uint8_t **)((long)arg2 + 0x98) = puVar25;
      }
    }
    if (iVar14 - iVar24 != 0 && iVar24 <= iVar14) {
      iVar9 = *(int *)((long)arg2 + 0x78);
      *(long *)((long)arg2 + 0x18) = *(long *)((long)arg2 + 0x18) + (long)iVar9;
      *(long *)((long)arg2 + 0x20) = *(long *)((long)arg2 + 0x20) + (long)(iVar9 >> 1);
      *(long *)((long)arg2 + 0x28) = *(long *)((long)arg2 + 0x28) + (long)(iVar9 >> 1);
      if (puVar25 != (uint8_t *)0x0) {
        *(uint8_t **)((long)arg2 + 0x98) = puVar25 + iVar9;
      }
      *(int *)((long)arg2 + 8) = iVar24 - iVar5;
      *(int *)((long)arg2 + 0xc) = *(int *)((long)arg2 + 0x7c) - iVar9;
      *(int *)((long)arg2 + 0x10) = iVar14 - iVar24;
      iVar9 = (**(code **)((long)arg2 + 0x40))();
    }
  }
  if (iVar8 + 1 == *(int *)((long)arg1 + 0xd0) && iVar4 < iVar17) {
    memcpy((void *)(*(long *)((long)arg1 + 0xb28) - __n_00),
           (void *)(lVar10 + (long)*(int *)((long)arg1 + 0xb40) * 0x10),__n_00);
    memcpy((void *)(*(long *)((long)arg1 + 0xb30) + -__n),
           (void *)((long)*(int *)((long)arg1 + 0xb44) * 8 + lVar23),__n);
    memcpy((void *)(-__n + *(long *)((long)arg1 + 0xb38)),
           (void *)(lVar28 + (long)*(int *)((long)arg1 + 0xb44) * 8),__n);
  }
  return iVar9;
}

Assistant:

static int FinishRow(void* arg1, void* arg2) {
  VP8Decoder* const dec = (VP8Decoder*)arg1;
  VP8Io* const io = (VP8Io*)arg2;
  int ok = 1;
  const VP8ThreadContext* const ctx = &dec->thread_ctx_;
  const int cache_id = ctx->id_;
  const int extra_y_rows = kFilterExtraRows[dec->filter_type_];
  const int ysize = extra_y_rows * dec->cache_y_stride_;
  const int uvsize = (extra_y_rows / 2) * dec->cache_uv_stride_;
  const int y_offset = cache_id * 16 * dec->cache_y_stride_;
  const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
  uint8_t* const ydst = dec->cache_y_ - ysize + y_offset;
  uint8_t* const udst = dec->cache_u_ - uvsize + uv_offset;
  uint8_t* const vdst = dec->cache_v_ - uvsize + uv_offset;
  const int mb_y = ctx->mb_y_;
  const int is_first_row = (mb_y == 0);
  const int is_last_row = (mb_y >= dec->br_mb_y_ - 1);

  if (dec->mt_method_ == 2) {
    ReconstructRow(dec, ctx);
  }

  if (ctx->filter_row_) {
    FilterRow(dec);
  }

  if (dec->dither_) {
    DitherRow(dec);
  }

  if (io->put != NULL) {
    int y_start = MACROBLOCK_VPOS(mb_y);
    int y_end = MACROBLOCK_VPOS(mb_y + 1);
    if (!is_first_row) {
      y_start -= extra_y_rows;
      io->y = ydst;
      io->u = udst;
      io->v = vdst;
    } else {
      io->y = dec->cache_y_ + y_offset;
      io->u = dec->cache_u_ + uv_offset;
      io->v = dec->cache_v_ + uv_offset;
    }

    if (!is_last_row) {
      y_end -= extra_y_rows;
    }
    if (y_end > io->crop_bottom) {
      y_end = io->crop_bottom;    // make sure we don't overflow on last row.
    }
    // If dec->alpha_data_ is not NULL, we have some alpha plane present.
    io->a = NULL;
    if (dec->alpha_data_ != NULL && y_start < y_end) {
      io->a = VP8DecompressAlphaRows(dec, io, y_start, y_end - y_start);
      if (io->a == NULL) {
        return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                           "Could not decode alpha data.");
      }
    }
    if (y_start < io->crop_top) {
      const int delta_y = io->crop_top - y_start;
      y_start = io->crop_top;
      assert(!(delta_y & 1));
      io->y += dec->cache_y_stride_ * delta_y;
      io->u += dec->cache_uv_stride_ * (delta_y >> 1);
      io->v += dec->cache_uv_stride_ * (delta_y >> 1);
      if (io->a != NULL) {
        io->a += io->width * delta_y;
      }
    }
    if (y_start < y_end) {
      io->y += io->crop_left;
      io->u += io->crop_left >> 1;
      io->v += io->crop_left >> 1;
      if (io->a != NULL) {
        io->a += io->crop_left;
      }
      io->mb_y = y_start - io->crop_top;
      io->mb_w = io->crop_right - io->crop_left;
      io->mb_h = y_end - y_start;
      ok = io->put(io);
    }
  }
  // rotate top samples if needed
  if (cache_id + 1 == dec->num_caches_) {
    if (!is_last_row) {
      memcpy(dec->cache_y_ - ysize, ydst + 16 * dec->cache_y_stride_, ysize);
      memcpy(dec->cache_u_ - uvsize, udst + 8 * dec->cache_uv_stride_, uvsize);
      memcpy(dec->cache_v_ - uvsize, vdst + 8 * dec->cache_uv_stride_, uvsize);
    }
  }

  return ok;
}